

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O3

string * __thiscall
cfd::api::HDWalletApi::GetPubkeyFromExtkey
          (string *__return_storage_ptr__,HDWalletApi *this,string *extkey,NetType net_type)

{
  pointer puVar1;
  undefined8 uVar2;
  char cVar3;
  CfdException *this_00;
  uint uVar4;
  string errmsg;
  uint32_t version;
  string result;
  undefined1 local_1d8 [40];
  pointer local_1b0;
  pointer puStack_1a8;
  pointer local_1a0;
  pointer local_198;
  pointer puStack_190;
  pointer local_188;
  pointer local_180;
  pointer puStack_178;
  pointer puStack_170;
  pointer local_168;
  ExtPubkey local_158;
  uint local_e8 [8];
  undefined1 local_c8 [96];
  pointer local_68;
  pointer puStack_60;
  pointer local_58;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  local_40 = 0;
  local_38[0] = 0;
  local_48 = local_38;
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_c8);
  cfd::core::ExtPubkey::ExtPubkey(&local_158);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_1d8,(string *)extkey);
  uVar2 = local_c8._0_8_;
  local_c8._0_8_ = local_1d8._0_8_;
  local_c8._8_8_ = local_1d8._8_8_;
  local_c8._16_8_ = local_1d8._16_8_;
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8._8_8_ = (pointer)0x0;
  local_1d8._16_8_ = (pointer)0x0;
  if ((pointer)uVar2 != (pointer)0x0) {
    operator_delete((void *)uVar2);
  }
  uVar2 = local_c8._40_8_;
  local_c8._24_8_ = local_1d8._24_8_;
  local_c8._32_8_ = local_1d8._32_8_;
  local_c8._40_8_ = local_1b0;
  local_c8._48_8_ = puStack_1a8;
  local_c8._56_8_ = local_1a0;
  local_1b0 = (pointer)0x0;
  puStack_1a8 = (pointer)0x0;
  local_1a0 = (pointer)0x0;
  if ((pointer)uVar2 != (pointer)0x0) {
    operator_delete((void *)uVar2);
  }
  uVar2 = local_c8._64_8_;
  local_c8._64_8_ = local_198;
  local_c8._72_8_ = puStack_190;
  local_c8._80_8_ = local_188;
  local_198 = (pointer)0x0;
  puStack_190 = (pointer)0x0;
  local_188 = (pointer)0x0;
  if ((pointer)uVar2 != (pointer)0x0) {
    operator_delete((void *)uVar2);
  }
  puVar1 = local_68;
  local_c8._88_8_ = local_180;
  local_68 = puStack_178;
  puStack_60 = puStack_170;
  local_58 = local_168;
  puStack_178 = (pointer)0x0;
  puStack_170 = (pointer)0x0;
  local_168 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    if (puStack_178 != (pointer)0x0) {
      operator_delete(puStack_178);
    }
  }
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0);
  }
  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._0_8_);
  }
  cVar3 = cfd::core::ExtPrivkey::IsValid();
  if (cVar3 == '\0') {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_1d8,(string *)extkey);
  }
  else {
    cfd::core::ExtPrivkey::GetExtPubkey();
  }
  puVar1 = local_158.serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_158.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_1d8._0_8_;
  local_158.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1d8._8_8_;
  local_158.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8._16_8_;
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8._8_8_ = (pointer)0x0;
  local_1d8._16_8_ = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = local_158.chaincode_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_158.version_ = local_1d8._24_4_;
  local_158.fingerprint_ = local_1d8._28_4_;
  local_158.depth_ = local_1d8[0x20];
  local_158._33_3_ = local_1d8._33_3_;
  local_158.child_num_ = local_1d8._36_4_;
  local_158.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = local_1b0;
  local_158.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puStack_1a8;
  local_158.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_1a0;
  local_1b0 = (pointer)0x0;
  puStack_1a8 = (pointer)0x0;
  local_1a0 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = local_158.pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_158.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = local_198;
  local_158.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puStack_190;
  local_158.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_188;
  local_198 = (pointer)0x0;
  puStack_190 = (pointer)0x0;
  local_188 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = local_158.tweak_sum_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_158.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = local_180;
  local_158.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puStack_178;
  local_158.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_170;
  local_180 = (pointer)0x0;
  puStack_178 = (pointer)0x0;
  puStack_170 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    if (local_180 != (pointer)0x0) {
      operator_delete(local_180);
    }
  }
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0);
  }
  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._0_8_);
  }
  local_e8[0] = cfd::core::ExtPubkey::GetVersion();
  uVar4 = 0x43587cf;
  if (net_type == kLiquidV1) {
    uVar4 = 0x488b21e;
  }
  if (net_type == kMainnet) {
    uVar4 = 0x488b21e;
  }
  if (local_e8[0] == uVar4) {
    cfd::core::ExtPubkey::GetPubkey();
    cfd::core::Pubkey::GetHex_abi_cxx11_();
    if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if (local_158.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_158.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_158.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_158.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68);
    }
    if ((pointer)local_c8._64_8_ != (pointer)0x0) {
      operator_delete((void *)local_c8._64_8_);
    }
    if ((pointer)local_c8._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_c8._40_8_);
    }
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    return __return_storage_ptr__;
  }
  local_1d8._0_8_ = "cfdapi_hdwallet.cpp";
  local_1d8._8_4_ = 0x166;
  local_1d8._16_8_ = "GetPubkeyFromExtkey";
  core::logger::log<unsigned_int&>
            ((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"Version unmatch. key version: {}",
             local_e8);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1d8._0_8_ = local_1d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d8,"extkey networkType unmatch.","");
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_1d8);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string HDWalletApi::GetPubkeyFromExtkey(
    const std::string& extkey, NetType net_type) const {
  std::string result;
  ExtPrivkey ext_privkey;
  ExtPubkey ext_pubkey;

  try {
    ext_privkey = ExtPrivkey(extkey);
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if ((errmsg.find(kBase58Error) == std::string::npos) &&
        (errmsg.find(kKeyTypeError) == std::string::npos)) {
      throw except;
    }
  }

  if (ext_privkey.IsValid()) {
    ext_pubkey = ext_privkey.GetExtPubkey();
  } else {
    try {
      ext_pubkey = ExtPubkey(extkey);
    } catch (const CfdException& pub_except) {
      std::string errmsg(pub_except.what());
      if (errmsg.find(kBase58Error) != std::string::npos) {
        warn(CFD_LOG_SOURCE, "Illegal extkey. base58 decode error.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal extkey. base58 decode error.");
      }
      throw pub_except;
    }
  }

  uint32_t version = ext_pubkey.GetVersion();
  uint32_t check_version = GetExtkeyVersion(ExtKeyType::kExtPubkey, net_type);
  if (version != check_version) {
    warn(CFD_LOG_SOURCE, "Version unmatch. key version: {}", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return ext_pubkey.GetPubkey().GetHex();
}